

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntrySplit(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  Var instance;
  int in_stack_00000010;
  undefined1 local_68 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x782,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bbf233;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_38,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((local_38._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x785,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bbf233:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_68,function,local_38,L"String.prototype.split",
             &stack0x00000000);
  if (((pSVar1->config).threadConfig)->m_ES6RegExSymbols == true) {
    if ((callInfo_local._0_4_ & 0xffffff) == 0) {
LAB_00bbf235:
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"String.prototype.split");
    }
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    BVar4 = JavascriptConversion::CheckObjectCoercible(pvVar6,pSVar1);
    if (BVar4 == 0) goto LAB_00bbf235;
    if ((callInfo_local._0_4_ & 0xfffffe) != 0) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      BVar4 = JavascriptOperators::IsUndefinedOrNull(pvVar6);
      if (BVar4 == 0) {
        pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        instance = GetRegExSymbolFunction(pvVar6,0x18,pSVar1);
        BVar4 = JavascriptOperators::IsUndefinedOrNull(instance);
        if (BVar4 == 0) {
          pvVar6 = CallRegExSymbolFunction<2>
                             (instance,pvVar6,(Arguments *)&callInfo_local,L"String.prototype.split"
                              ,pSVar1);
          goto LAB_00bbf1fe;
        }
      }
    }
  }
  __tag.entry.next = (Entry *)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&callInfo_local,pSVar1,L"String.prototype.split",
             (JavascriptString **)&__tag.entry.next);
  pvVar6 = DoStringSplit((Arguments *)&callInfo_local,&local_38,(JavascriptString *)__tag.entry.next
                         ,pSVar1);
LAB_00bbf1fe:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_68);
  return pvVar6;
}

Assistant:

Var JavascriptString::EntrySplit(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        PCWSTR const varName = _u("String.prototype.split");

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, varName);

        auto fallback = [&](JavascriptString* stringObj)
        {
            return DoStringSplit(args, callInfo, stringObj, scriptContext);
        };
        return DelegateToRegExSymbolFunction<2>(args, PropertyIds::_symbolSplit, fallback, varName, scriptContext);
    }